

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

_Bool mountain_top_possible(wchar_t place)

{
  topography tVar1;
  byte bVar2;
  
  if (world->levels[place].up == (char *)0x0) {
    tVar1 = world->levels[place].topography;
    bVar2 = 1;
    if (tVar1 < (TOP_VALLEY|TOP_FOREST)) {
      bVar2 = (byte)(0x6e >> ((byte)tVar1 & 0x1f));
    }
  }
  else {
    bVar2 = 0;
  }
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool mountain_top_possible(int place)
{
	struct level *current = &world->levels[place];

	if (current->up) {
		return false;
	} else if (current->topography == TOP_CAVE) {
		return false;
	} else if (current->topography == TOP_MOUNTAINTOP) {
		return false;
	} else if (current->topography == TOP_SWAMP) {
		return false;
	} else if (current->topography == TOP_TOWN) {
		return false;
	} else if (current->topography == TOP_VALLEY) {
		return false;
	}
	return true;
}